

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

HighsInt create(HighsIndexCollection *index_collection,HighsInt *mask,HighsInt dimension)

{
  int in_EDX;
  int *in_RDI;
  bool bVar1;
  vector<int,_std::allocator<int>_> *__x;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  allocator_type *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_4;
  
  bVar1 = -1 < in_EDX;
  if (bVar1) {
    *in_RDI = in_EDX;
    *(undefined1 *)(in_RDI + 0xc) = 1;
    __x = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc7;
    std::allocator<int>::allocator((allocator<int> *)0x7ef330);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::vector<int,_std::allocator<int>_>::operator=(in_stack_ffffffffffffffb0,__x);
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffb0);
    std::allocator<int>::~allocator((allocator<int> *)0x7ef371);
  }
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

HighsInt create(HighsIndexCollection& index_collection, const HighsInt* mask,
                const HighsInt dimension) {
  // Create an index collection for the given mask
  if (dimension < 0) return kIndexCollectionCreateIllegalMaskSize;
  index_collection.dimension_ = dimension;
  index_collection.is_mask_ = true;
  index_collection.mask_ = {mask, mask + dimension};
  return kIndexCollectionCreateOk;
}